

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

SpecifyBlockSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::SpecifyBlockSymbol,slang::ast::Compilation&,slang::SourceLocation>
          (BumpAllocator *this,Compilation *args,SourceLocation *args_1)

{
  SourceLocation SVar1;
  SpecifyBlockSymbol *thisSym_;
  
  thisSym_ = (SpecifyBlockSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((SpecifyBlockSymbol *)this->endPtr < thisSym_ + 1) {
    thisSym_ = (SpecifyBlockSymbol *)allocateSlow(this,0x78,8);
  }
  else {
    this->head->current = (byte *)(thisSym_ + 1);
  }
  SVar1 = *args_1;
  (thisSym_->super_Symbol).kind = SpecifyBlock;
  (thisSym_->super_Symbol).name._M_len = 0;
  (thisSym_->super_Symbol).name._M_str = "";
  (thisSym_->super_Symbol).location = SVar1;
  (thisSym_->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (thisSym_->super_Symbol).parentScope = (Scope *)0x0;
  (thisSym_->super_Symbol).nextInScope = (Symbol *)0x0;
  (thisSym_->super_Symbol).indexInScope = 0;
  ast::Scope::Scope(&thisSym_->super_Scope,args,&thisSym_->super_Symbol);
  return thisSym_;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }